

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  
  printOpenHeader(this,_name);
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam00000000001e2ec0 = 0x2e2e2e2e2e2e2e;
    uRam00000000001e2ec7._0_1_ = '.';
    uRam00000000001e2ec7._1_1_ = '.';
    uRam00000000001e2ec7._2_1_ = '.';
    uRam00000000001e2ec7._3_1_ = '.';
    uRam00000000001e2ec7._4_1_ = '.';
    uRam00000000001e2ec7._5_1_ = '.';
    uRam00000000001e2ec7._6_1_ = '.';
    uRam00000000001e2ec7._7_1_ = '.';
    DAT_001e2eb0 = '.';
    DAT_001e2eb0_1._0_1_ = '.';
    DAT_001e2eb0_1._1_1_ = '.';
    DAT_001e2eb0_1._2_1_ = '.';
    DAT_001e2eb0_1._3_1_ = '.';
    DAT_001e2eb0_1._4_1_ = '.';
    DAT_001e2eb0_1._5_1_ = '.';
    DAT_001e2eb0_1._6_1_ = '.';
    uRam00000000001e2eb8 = 0x2e2e2e2e2e2e2e;
    DAT_001e2ebf = 0x2e;
    DAT_001e2ea0 = '.';
    DAT_001e2ea0_1._0_1_ = '.';
    DAT_001e2ea0_1._1_1_ = '.';
    DAT_001e2ea0_1._2_1_ = '.';
    DAT_001e2ea0_1._3_1_ = '.';
    DAT_001e2ea0_1._4_1_ = '.';
    DAT_001e2ea0_1._5_1_ = '.';
    DAT_001e2ea0_1._6_1_ = '.';
    uRam00000000001e2ea8._0_1_ = '.';
    uRam00000000001e2ea8._1_1_ = '.';
    uRam00000000001e2ea8._2_1_ = '.';
    uRam00000000001e2ea8._3_1_ = '.';
    uRam00000000001e2ea8._4_1_ = '.';
    uRam00000000001e2ea8._5_1_ = '.';
    uRam00000000001e2ea8._6_1_ = '.';
    uRam00000000001e2ea8._7_1_ = '.';
    DAT_001e2e90 = '.';
    DAT_001e2e90_1._0_1_ = '.';
    DAT_001e2e90_1._1_1_ = '.';
    DAT_001e2e90_1._2_1_ = '.';
    DAT_001e2e90_1._3_1_ = '.';
    DAT_001e2e90_1._4_1_ = '.';
    DAT_001e2e90_1._5_1_ = '.';
    DAT_001e2e90_1._6_1_ = '.';
    uRam00000000001e2e98._0_1_ = '.';
    uRam00000000001e2e98._1_1_ = '.';
    uRam00000000001e2e98._2_1_ = '.';
    uRam00000000001e2e98._3_1_ = '.';
    uRam00000000001e2e98._4_1_ = '.';
    uRam00000000001e2e98._5_1_ = '.';
    uRam00000000001e2e98._6_1_ = '.';
    uRam00000000001e2e98._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam00000000001e2e88._0_1_ = '.';
    uRam00000000001e2e88._1_1_ = '.';
    uRam00000000001e2e88._2_1_ = '.';
    uRam00000000001e2e88._3_1_ = '.';
    uRam00000000001e2e88._4_1_ = '.';
    uRam00000000001e2e88._5_1_ = '.';
    uRam00000000001e2e88._6_1_ = '.';
    uRam00000000001e2e88._7_1_ = '.';
    DAT_001e2ecf = 0;
  }
  poVar1 = std::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)46>()::line);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void ConsoleReporter::printClosedHeader(std::string const& _name) {
    printOpenHeader(_name);
    stream << getLineOfChars<'.'>() << '\n';
}